

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astMessageSendNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_astMessageSendNode_t *psVar1;
  _Bool _Var2;
  sysbvm_tuple_t *psVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t value;
  sysbvm_tuple_t sVar5;
  size_t sVar6;
  bool bVar7;
  size_t local_150;
  size_t i_1;
  size_t applicationArgumentCount;
  size_t i;
  size_t applicationArgumentCount_1;
  _Bool hasExplicitSolvedLookupType;
  sysbvm_astTupleWithLookupStartingFromNode_t *objectLookup;
  undefined1 auStack_118 [7];
  _Bool isDoesNotUnderstand;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_160_20_88b2b351 gcFrame;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar3 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0xa0);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = 0x14;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar4 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,*psVar3);
  gcFrameRecord.roots[3] = sVar4;
  _auStack_118 = (sysbvm_stackFrameRecord_s *)0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = gcFrameRecord.roots[2];
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)auStack_118);
  bVar7 = false;
  if (gcFrameRecord.roots[5] == 0) {
    sVar4 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                      (context,gcFrameRecord.roots[7],(context->roots).symbolType,*psVar3);
    gcFrameRecord.roots[7] = sVar4;
  }
  else {
    gcFrame.sendNode =
         (sysbvm_astMessageSendNode_t *)
         sysbvm_interpreter_analyzeASTWithDirectTypeWithEnvironment
                   (context,gcFrameRecord.roots[5],*psVar3);
    gcFrameRecord.roots[5] = (sysbvm_tuple_t)gcFrame.sendNode;
    gcFrame.analyzedArguments = sysbvm_astNode_getAnalyzedType((sysbvm_tuple_t)gcFrame.sendNode);
    _Var2 = sysbvm_astNode_isTupleWithLookupStartingFromNode
                      (context,(sysbvm_tuple_t)gcFrame.sendNode);
    if (_Var2) {
      psVar1 = (sysbvm_astMessageSendNode_t *)(gcFrame.sendNode)->receiver;
      gcFrameRecord.roots[5] = (sysbvm_tuple_t)psVar1;
      gcFrameRecord.roots[6] = (gcFrame.sendNode)->receiverLookupType;
      gcFrame.sendNode = psVar1;
    }
    else if (gcFrameRecord.roots[6] != 0) {
      sVar4 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                        (context,gcFrameRecord.roots[6],(context->roots).typeType,*psVar3);
      gcFrameRecord.roots[6] = sVar4;
    }
    if (gcFrame.analyzedArguments == 0) {
      sVar4 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                        (context,gcFrameRecord.roots[7],(context->roots).symbolType,*psVar3);
      gcFrameRecord.roots[7] = sVar4;
      _Var2 = sysbvm_astNode_isLiteralNode(context,gcFrameRecord.roots[7]);
      if (_Var2) {
        sVar4 = sysbvm_astLiteralNode_getValue(gcFrameRecord.roots[7]);
        gcFrame.selector =
             sysbvm_type_lookupMacroSelector(context,(context->roots).anyValueType,sVar4);
      }
    }
    else {
      sVar4 = sysbvm_tuple_getType(context,gcFrame.analyzedArguments);
      sVar4 = sysbvm_type_getAnalyzeMessageSendNodeWithEnvironmentFunction(context,sVar4);
      if ((sVar4 != 0) &&
         (_Var2 = sysbvm_astNode_isLiteralNode(context,gcFrameRecord.roots[5]), _Var2)) {
        sVar4 = sysbvm_function_apply3
                          (context,sVar4,gcFrame.analyzedArguments,
                           (sysbvm_tuple_t)gcFrameRecord.roots,*psVar3);
        sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_118);
        sysbvm_stackFrame_popRecord
                  ((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
        return sVar4;
      }
      sVar4 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                        (context,gcFrameRecord.roots[7],(context->roots).symbolType,*psVar3);
      gcFrameRecord.roots[7] = sVar4;
      _Var2 = sysbvm_astNode_isLiteralNode(context,gcFrameRecord.roots[7]);
      if (_Var2) {
        sVar4 = sysbvm_astLiteralNode_getValue(gcFrameRecord.roots[7]);
        gcFrame.selector = sysbvm_type_lookupMacroSelector(context,gcFrame.analyzedArguments,sVar4);
        if (gcFrame.selector == 0) {
          gcFrame.selector = sysbvm_type_lookupSelector(context,gcFrame.analyzedArguments,sVar4);
        }
        if (gcFrame.selector == 0) {
          gcFrame.selector =
               sysbvm_type_lookupFallbackSelector(context,gcFrame.analyzedArguments,sVar4);
        }
        gcFrame.receiverMetaType = gcFrame.analyzedArguments;
        if ((gcFrame.selector == 0) &&
           (_Var2 = sysbvm_type_isReferenceType(gcFrame.analyzedArguments), _Var2)) {
          gcFrame.receiverMetaType = sysbvm_type_decay(context,gcFrame.analyzedArguments);
          gcFrame.selector = sysbvm_type_lookupMacroSelector(context,gcFrame.receiverMetaType,sVar4)
          ;
          if (gcFrame.selector == 0) {
            gcFrame.selector = sysbvm_type_lookupSelector(context,gcFrame.receiverMetaType,sVar4);
          }
          if (gcFrame.selector == 0) {
            gcFrame.selector =
                 sysbvm_type_lookupFallbackSelector(context,gcFrame.receiverMetaType,sVar4);
          }
        }
        if (gcFrame.selector == 0) {
          gcFrame.selector =
               sysbvm_type_lookupMacroSelector
                         (context,gcFrame.analyzedArguments,
                          (context->roots).doesNotUnderstandSelector);
          if (gcFrame.selector == 0) {
            gcFrame.selector =
                 sysbvm_type_lookupSelector
                           (context,gcFrame.analyzedArguments,
                            (context->roots).doesNotUnderstandSelector);
          }
          if (gcFrame.selector == 0) {
            gcFrame.selector =
                 sysbvm_type_lookupFallbackSelector
                           (context,gcFrame.analyzedArguments,
                            (context->roots).doesNotUnderstandSelector);
          }
          _Var2 = sysbvm_function_isMacro(context,gcFrame.selector);
          if (!_Var2) {
            gcFrame.selector = 0;
          }
          bVar7 = gcFrame.selector != 0;
          gcFrame.receiverMetaType = gcFrame.analyzedArguments;
        }
      }
    }
  }
  if ((bVar7) && (_Var2 = sysbvm_function_isMacro(context,gcFrame.selector), _Var2)) {
    sVar4 = sysbvm_macroContext_create(context,*arguments,gcFrameRecord.roots[2],*psVar3);
    sVar4 = sysbvm_function_apply3
                      (context,gcFrame.selector,sVar4,gcFrameRecord.roots[5],
                       (sysbvm_tuple_t)gcFrameRecord.roots);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_118);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
    sVar4 = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                      (context,sVar4,*psVar3);
    return sVar4;
  }
  _Var2 = sysbvm_astNode_isLiteralNode(context,gcFrameRecord.roots[6]);
  if (gcFrame.selector == 0) {
LAB_001401d4:
    if (gcFrame.selector == 0) {
      _Var2 = sysbvm_tuple_boolean_decode(gcFrameRecord.roots[9]);
      if (!_Var2) {
        sVar4 = sysbvm_type_decay(context,gcFrame.analyzedArguments);
        _Var2 = sysbvm_type_isDynamic(sVar4);
        if (!_Var2) {
          sysbvm_error("Cannot send undeclared message to receiver without a dynamic type.");
        }
      }
    }
    else {
      gcFrameRecord.roots[10] = gcFrame.selector;
      gcFrameRecord.roots[0xb] = gcFrame.receiverMetaType;
      sVar4 = sysbvm_tuple_getType(context,gcFrame.selector);
      sVar5 = sysbvm_tuple_getType(context,sVar4);
      sVar5 = sysbvm_type_getAnalyzeAndTypeCheckMessageSendNodeWithEnvironment(context,sVar5);
      if (sVar5 != 0) {
        sysbvm_stackFrame_popRecord
                  ((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
        sVar4 = sysbvm_function_apply3
                          (context,sVar5,sVar4,(sysbvm_tuple_t)gcFrameRecord.roots,*psVar3);
        return sVar4;
      }
    }
    sVar4 = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment
                      (context,(sysbvm_tuple_t)gcFrame.sendNode,*psVar3);
    gcFrameRecord.roots[5] = sVar4;
    sVar6 = sysbvm_array_getSize(gcFrameRecord.roots[8]);
    sVar4 = sysbvm_array_create(context,sVar6);
    for (local_150 = 0; local_150 < sVar6; local_150 = local_150 + 1) {
      sVar5 = sysbvm_array_at(gcFrameRecord.roots[8],local_150);
      sVar5 = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context,sVar5,*psVar3);
      sysbvm_array_atPut(sVar4,local_150,sVar5);
    }
    gcFrameRecord.roots[8] = sVar4;
    gcFrameRecord.roots[4] = (context->roots).anyValueType;
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_118);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
    context_local = (sysbvm_context_t *)gcFrameRecord.roots;
  }
  else {
    if (!_Var2) {
      _Var2 = sysbvm_astNode_isLiteralNode(context,gcFrameRecord.roots[5]);
      _Var2 = sysbvm_function_shouldOptimizeLookup
                        (context,gcFrame.selector,gcFrame.receiverMetaType,_Var2);
      if (!_Var2) goto LAB_001401d4;
    }
    sVar6 = sysbvm_array_getSize(gcFrameRecord.roots[8]);
    sVar4 = sysbvm_astLiteralNode_create(context,gcFrameRecord.roots[2],gcFrame.selector);
    sVar5 = sysbvm_array_create(context,sVar6 + 1);
    sysbvm_array_atPut(sVar5,0,gcFrameRecord.roots[5]);
    for (applicationArgumentCount = 0; applicationArgumentCount < sVar6;
        applicationArgumentCount = applicationArgumentCount + 1) {
      value = sysbvm_array_at(gcFrameRecord.roots[8],applicationArgumentCount);
      sysbvm_array_atPut(sVar5,applicationArgumentCount + 1,value);
    }
    sVar4 = sysbvm_astUnexpandedApplicationNode_create(context,gcFrameRecord.roots[2],sVar4,sVar5);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
    context_local =
         (sysbvm_context_t *)
         sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context,sVar4,*psVar3);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMessageSendNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astMessageSendNode_t *sendNode;
        sysbvm_tuple_t analyzedReceiver;
        sysbvm_tuple_t analyzedReceiverTypeExpression;
        sysbvm_tuple_t analyzedSelector;
        sysbvm_tuple_t analyzedArguments;

        sysbvm_tuple_t receiverType;
        sysbvm_tuple_t receiverMetaType;
        sysbvm_tuple_t methodOwner;
        sysbvm_tuple_t selector;
        sysbvm_tuple_t method;
        sysbvm_tuple_t methodType;
        sysbvm_tuple_t analysisFunction;
        sysbvm_tuple_t result;
        sysbvm_tuple_t newMethodNode;
        sysbvm_tuple_t newArgumentNodes;
        sysbvm_tuple_t unexpandedApplicationNode;

        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t analyzedArgumentNode;

        sysbvm_tuple_t macroContext;
        sysbvm_tuple_t expansionResult;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.sendNode = (sysbvm_astMessageSendNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.sendNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.sendNode->super.sourcePosition);

    bool isDoesNotUnderstand = false;
    if(gcFrame.sendNode->receiver)
    {
        gcFrame.analyzedReceiver = sysbvm_interpreter_analyzeASTWithDirectTypeWithEnvironment(context, gcFrame.sendNode->receiver, *environment);
        gcFrame.sendNode->receiver = gcFrame.analyzedReceiver;
        gcFrame.receiverType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedReceiver);

        // Inline the object with lookup starting from node.
        if(sysbvm_astNode_isTupleWithLookupStartingFromNode(context, gcFrame.analyzedReceiver))
        {
            sysbvm_astTupleWithLookupStartingFromNode_t *objectLookup = (sysbvm_astTupleWithLookupStartingFromNode_t*)gcFrame.analyzedReceiver;
            gcFrame.analyzedReceiver = objectLookup->tupleExpression;
            gcFrame.sendNode->receiver = gcFrame.analyzedReceiver;
            
            gcFrame.analyzedReceiverTypeExpression = objectLookup->typeExpression;
            gcFrame.sendNode->receiverLookupType = gcFrame.analyzedReceiverTypeExpression;
            
        }
        else if(gcFrame.sendNode->receiverLookupType)
        {
            gcFrame.analyzedReceiverTypeExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.sendNode->receiverLookupType, context->roots.typeType, *environment);
            gcFrame.sendNode->receiverLookupType = gcFrame.analyzedReceiverTypeExpression;
        }

        if(gcFrame.receiverType)
        {
            // If the receiver is a literal node, we can attempt to forward the message send node analysis.
            gcFrame.receiverMetaType = sysbvm_tuple_getType(context, gcFrame.receiverType);
            gcFrame.analysisFunction = sysbvm_type_getAnalyzeMessageSendNodeWithEnvironmentFunction(context, gcFrame.receiverMetaType);

            // HACK: Remove this literal check when properly implementing this.
            if(gcFrame.analysisFunction && sysbvm_astNode_isLiteralNode(context, gcFrame.sendNode->receiver))
            {
                gcFrame.result = sysbvm_function_apply3(context, gcFrame.analysisFunction, gcFrame.receiverType, (sysbvm_tuple_t)gcFrame.sendNode, *environment);
                SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
                SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
                return gcFrame.result;
            }

            // If the selector is a literal, attempt to perform a static lookup.
            gcFrame.analyzedSelector = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.sendNode->selector, context->roots.symbolType, *environment);
            gcFrame.sendNode->selector = gcFrame.analyzedSelector;
            if(sysbvm_astNode_isLiteralNode(context, gcFrame.sendNode->selector))
            {
                gcFrame.selector = sysbvm_astLiteralNode_getValue(gcFrame.sendNode->selector);
                gcFrame.methodOwner = gcFrame.receiverType;
                gcFrame.method = sysbvm_type_lookupMacroSelector(context, gcFrame.receiverType, gcFrame.selector);
                if(!gcFrame.method)
                    gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.receiverType, gcFrame.selector);
                if(!gcFrame.method)
                    gcFrame.method = sysbvm_type_lookupFallbackSelector(context, gcFrame.receiverType, gcFrame.selector);

                if(!gcFrame.method && sysbvm_type_isReferenceType(gcFrame.receiverType))
                {
                    gcFrame.methodOwner = sysbvm_type_decay(context, gcFrame.receiverType);
                    gcFrame.method = sysbvm_type_lookupMacroSelector(context, gcFrame.methodOwner, gcFrame.selector);
                    if(!gcFrame.method)
                        gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.methodOwner, gcFrame.selector);
                    if(!gcFrame.method)
                        gcFrame.method = sysbvm_type_lookupFallbackSelector(context, gcFrame.methodOwner, gcFrame.selector);
                }

                // does not understand macro?
                if(!gcFrame.method)
                {
                    gcFrame.methodOwner = gcFrame.receiverType;
                    if(!gcFrame.method)
                        gcFrame.method = sysbvm_type_lookupMacroSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);
                    if(!gcFrame.method)
                        gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);
                    if(!gcFrame.method)
                        gcFrame.method = sysbvm_type_lookupFallbackSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);

                    if(!sysbvm_function_isMacro(context, gcFrame.method))
                        gcFrame.method = SYSBVM_NULL_TUPLE;
                    isDoesNotUnderstand = gcFrame.method != SYSBVM_NULL_TUPLE;
                }
            }
        }
        else
        {
            gcFrame.analyzedSelector = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.sendNode->selector, context->roots.symbolType, *environment);
            gcFrame.sendNode->selector = gcFrame.analyzedSelector;
            if(sysbvm_astNode_isLiteralNode(context, gcFrame.sendNode->selector))
            {
                gcFrame.selector = sysbvm_astLiteralNode_getValue(gcFrame.sendNode->selector);
                gcFrame.method = sysbvm_type_lookupMacroSelector(context, context->roots.anyValueType, gcFrame.selector);
            }
        }
    }
    else
    {
        gcFrame.analyzedSelector = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.sendNode->selector, context->roots.symbolType, *environment);
        gcFrame.sendNode->selector = gcFrame.analyzedSelector;
    }

    // Does not understand: 
    if(isDoesNotUnderstand && sysbvm_function_isMacro(context, gcFrame.method))
    {
        // Clear the analyzer token.
        gcFrame.macroContext = sysbvm_macroContext_create(context, *node, gcFrame.sendNode->super.sourcePosition, *environment);
        gcFrame.expansionResult = sysbvm_function_apply3(context, gcFrame.method, gcFrame.macroContext, gcFrame.sendNode->receiver, (sysbvm_tuple_t)gcFrame.sendNode);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);

        // Analyze and evaluate the resulting node.
        return sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.expansionResult, *environment);
    }

    // Turn this node onto an unexpanded application.
    bool hasExplicitSolvedLookupType = sysbvm_astNode_isLiteralNode(context, gcFrame.sendNode->receiverLookupType);
    if(gcFrame.method && (hasExplicitSolvedLookupType || sysbvm_function_shouldOptimizeLookup(context, gcFrame.method, gcFrame.methodOwner, sysbvm_astNode_isLiteralNode(context, gcFrame.sendNode->receiver))))
    {
        size_t applicationArgumentCount = sysbvm_array_getSize(gcFrame.sendNode->arguments);
        gcFrame.newMethodNode = sysbvm_astLiteralNode_create(context, gcFrame.sendNode->super.sourcePosition, gcFrame.method);

        gcFrame.newArgumentNodes = sysbvm_array_create(context, 1 + applicationArgumentCount);
        sysbvm_array_atPut(gcFrame.newArgumentNodes, 0, gcFrame.sendNode->receiver);
        for(size_t i = 0; i < applicationArgumentCount; ++i)
            sysbvm_array_atPut(gcFrame.newArgumentNodes, i + 1, sysbvm_array_at(gcFrame.sendNode->arguments, i));

        gcFrame.unexpandedApplicationNode = sysbvm_astUnexpandedApplicationNode_create(context, gcFrame.sendNode->super.sourcePosition, gcFrame.newMethodNode, gcFrame.newArgumentNodes);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.unexpandedApplicationNode, *environment);
    }

    if(gcFrame.method)
    {
        gcFrame.sendNode->boundMethod = gcFrame.method;
        gcFrame.sendNode->boundMethodOwner = gcFrame.methodOwner;
        gcFrame.methodType = sysbvm_tuple_getType(context, gcFrame.method);

        gcFrame.analysisFunction = sysbvm_type_getAnalyzeAndTypeCheckMessageSendNodeWithEnvironment(context, sysbvm_tuple_getType(context, gcFrame.methodType));
        if(gcFrame.analysisFunction)
        {
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return sysbvm_function_apply3(context, gcFrame.analysisFunction, gcFrame.methodType, (sysbvm_tuple_t)gcFrame.sendNode, *environment);
        }
    }
    else
    {
        if(!sysbvm_tuple_boolean_decode(gcFrame.sendNode->isDynamic) && !sysbvm_type_isDynamic(sysbvm_type_decay(context, gcFrame.receiverType)))
            sysbvm_error("Cannot send undeclared message to receiver without a dynamic type.");
    }

    gcFrame.analyzedReceiver = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.analyzedReceiver, *environment);
    gcFrame.sendNode->receiver = gcFrame.analyzedReceiver;

    size_t applicationArgumentCount = sysbvm_array_getSize(gcFrame.sendNode->arguments);
    gcFrame.analyzedArguments = sysbvm_array_create(context, applicationArgumentCount);
    for(size_t i = 0; i < applicationArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at(gcFrame.sendNode->arguments, i);
        gcFrame.analyzedArgumentNode = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.argumentNode, *environment);
        sysbvm_array_atPut(gcFrame.analyzedArguments, i, gcFrame.analyzedArgumentNode);
    }

    gcFrame.sendNode->arguments = gcFrame.analyzedArguments;
    gcFrame.sendNode->super.analyzedType = context->roots.anyValueType;
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.sendNode;
}